

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void jmp_ensure_true_falls_through(Parser *psr,Node *node)

{
  Primitive PVar1;
  int to_add;
  BcIns *pBVar2;
  BcOp BVar3;
  int iVar4;
  Function *pFVar5;
  int tmp;
  BcOp inverted;
  BcIns *cond;
  Node *node_local;
  Parser *psr_local;
  
  if ((node->field_1).jmp.false_list < (node->field_1).reloc_idx) {
    pFVar5 = psr_fn(psr);
    pBVar2 = pFVar5->ins;
    PVar1 = (node->field_1).prim;
    BVar3 = bc_op(pBVar2[(int)(PVar1 + ~PRIM_NIL)]);
    BVar3 = relop_invert(BVar3);
    bc_set_op(pBVar2 + (int)(PVar1 + ~PRIM_NIL),BVar3);
    to_add = (node->field_1).reloc_idx;
    iVar4 = jmp_follow(psr,(node->field_1).reloc_idx);
    (node->field_1).reloc_idx = iVar4;
    jmp_list_append(psr,&(node->field_1).jmp.false_list,to_add);
  }
  return;
}

Assistant:

static void jmp_ensure_true_falls_through(Parser *psr, Node *node) {
	// Note `true_list` and `false_list` point to the JMP instruction with the
	// LARGEST PC in the true and false case jump lists. Thus if the true list
	// comes last, then the false case must fall through. We don't want this -
	// we want the true case to fall through - so invert the last instruction.
	if (node->jmp.true_list > node->jmp.false_list) {
		// Invert the condition
		BcIns *cond = &psr_fn(psr)->ins[node->jmp.true_list - 1];
		BcOp inverted = relop_invert(bc_op(*cond));
		bc_set_op(cond, inverted);

		// Remove this particular jump from the true list
		int tmp = node->jmp.true_list;
		node->jmp.true_list = jmp_follow(psr, node->jmp.true_list);

		// Add the jump to the false list
		jmp_list_append(psr, &node->jmp.false_list, tmp);
	}
}